

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_GMAA_MAAstar.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  ProblemDecTiger *this;
  size_t h;
  ProblemDecTiger pdt;
  ulong local_260;
  ProblemDecTiger local_258;
  int local_4;
  
  local_4 = 0;
  ProblemDecTiger::ProblemDecTiger(&local_258);
  for (local_260 = 1; local_260 < 4; local_260 = local_260 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"------gmaa MAA* QBG  -horizon=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_260);
    poVar1 = std::operator<<(poVar1,"-------");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    TestGMAA_MAAstar(pdt.super_DecPOMDPDiscrete.super_MultiAgentDecisionProcessDiscrete._288_8_,
                     (DecPOMDPDiscrete *)
                     pdt.super_DecPOMDPDiscrete.super_MultiAgentDecisionProcessDiscrete._280_8_,
                     pdt.super_DecPOMDPDiscrete.super_MultiAgentDecisionProcessDiscrete._276_4_);
    poVar1 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"------gmaa MAA* QPOMDP  -horizon=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_260);
    poVar1 = std::operator<<(poVar1,"----");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    TestGMAA_MAAstar(pdt.super_DecPOMDPDiscrete.super_MultiAgentDecisionProcessDiscrete._288_8_,
                     (DecPOMDPDiscrete *)
                     pdt.super_DecPOMDPDiscrete.super_MultiAgentDecisionProcessDiscrete._280_8_,
                     pdt.super_DecPOMDPDiscrete.super_MultiAgentDecisionProcessDiscrete._276_4_);
    poVar1 = std::operator<<((ostream *)&std::cout,"---------------------------------------");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"------gmaa MAA* QMDP  -horizon=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_260);
    poVar1 = std::operator<<(poVar1,"------");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    TestGMAA_MAAstar(pdt.super_DecPOMDPDiscrete.super_MultiAgentDecisionProcessDiscrete._288_8_,
                     (DecPOMDPDiscrete *)
                     pdt.super_DecPOMDPDiscrete.super_MultiAgentDecisionProcessDiscrete._280_8_,
                     pdt.super_DecPOMDPDiscrete.super_MultiAgentDecisionProcessDiscrete._276_4_);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"\n\nTotal ticks ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(anonymous_namespace)::tot_ticks);
  poVar1 = std::operator<<(poVar1," clock ticks = ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(double)(anonymous_namespace)::tot_ticks /
                             (double)(anonymous_namespace)::cps);
  poVar1 = std::operator<<(poVar1,"s");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Total utime = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(anonymous_namespace)::tot_utime);
  poVar1 = std::operator<<(poVar1," clock ticks = ");
  this = (ProblemDecTiger *)
         std::ostream::operator<<
                   (poVar1,(double)(anonymous_namespace)::tot_utime /
                           (double)(anonymous_namespace)::cps);
  poVar1 = std::operator<<((ostream *)this,"s");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  ProblemDecTiger::~ProblemDecTiger(this);
  return local_4;
}

Assistant:

int main()
{    
    ProblemDecTiger pdt;

    for(size_t h = 1; h < 4; h++)
    {

        cout << "---------------------------------------"<<endl;
        cout << "------gmaa MAA* QBG  -horizon="<<h<<"-------"<<endl;
        TestGMAA_MAAstar(h, pdt, eQBG);        
        cout << "---------------------------------------"<<endl;
        cout << "------gmaa MAA* QPOMDP  -horizon="<<h<<"----"<<endl;
        TestGMAA_MAAstar(h, pdt, eQPOMDP);
        cout << "---------------------------------------"<<endl;
        cout << "------gmaa MAA* QMDP  -horizon="<<h<<"------"<<endl;
        TestGMAA_MAAstar(h, pdt, eQMDP);
    }
    
    cout << "\n\nTotal ticks "<< tot_ticks << " clock ticks = " << 
        (double)(tot_ticks) / cps <<"s" << endl <<
        "Total utime = "<< tot_utime << " clock ticks = "<< 
        (double (tot_utime))/ cps << "s" << endl;
}